

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O0

void __thiscall
despot::SimpleRockSample::PrintBelief(SimpleRockSample *this,Belief *belief,ostream *out)

{
  double dVar1;
  value_type pSVar2;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  size_type sVar3;
  const_reference ppSVar4;
  reference pvVar5;
  ostream *poVar6;
  void *pvVar7;
  SimpleState *state;
  State *particle;
  int i;
  allocator<double> local_49;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> pos_probs;
  double rock_status;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  ostream *out_local;
  Belief *belief_local;
  SimpleRockSample *this_local;
  
  this_00 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
            (**(code **)(*(long *)belief + 0x30))();
  pos_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::allocator<double>::allocator(&local_49);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_48,3,&local_49);
  std::allocator<double>::~allocator(&local_49);
  particle._0_4_ = 0;
  while( true ) {
    sVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this_00);
    if (sVar3 <= (ulong)(long)(int)particle) break;
    ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (this_00,(long)(int)particle);
    pSVar2 = *ppSVar4;
    pos_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((double)*(int *)(pSVar2 + 0x24) * *(double *)(pSVar2 + 0x18) +
                  (double)pos_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    dVar1 = *(double *)(pSVar2 + 0x18);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_48,
                        (long)*(int *)(pSVar2 + 0x20));
    *pvVar5 = dVar1 + *pvVar5;
    particle._0_4_ = (int)particle + 1;
  }
  poVar6 = std::operator<<(out,"Rock belief: ");
  pvVar7 = (void *)std::ostream::operator<<
                             (poVar6,(double)pos_probs.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(out,"Position belief:");
  poVar6 = std::operator<<(poVar6," LEFT");
  poVar6 = std::operator<<(poVar6,":");
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_48,0);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
  poVar6 = std::operator<<(poVar6," MIDDLE");
  poVar6 = std::operator<<(poVar6,":");
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_48,1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
  poVar6 = std::operator<<(poVar6," RIGHT");
  poVar6 = std::operator<<(poVar6,":");
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_48,2);
  pvVar7 = (void *)std::ostream::operator<<(poVar6,*pvVar5);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  return;
}

Assistant:

void SimpleRockSample::PrintBelief(const Belief& belief, ostream& out) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief&>(belief).particles();

	double rock_status = 0;
	vector<double> pos_probs(3);
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		const SimpleState* state = static_cast<const SimpleState*>(particle);
		rock_status += state->rock_status * particle->weight;
		pos_probs[state->rover_position] += particle->weight;
	}

	out << "Rock belief: " << rock_status << endl;

	out << "Position belief:" << " LEFT" << ":" << pos_probs[0] << " MIDDLE"
		<< ":" << pos_probs[1] << " RIGHT" << ":" << pos_probs[2] << endl;
}